

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

kStatus __thiscall
gnilk::Log::Info<char_const*,char_const*,char_const*,char_const*>
          (Log *this,char *arguments,char *arguments_1,char *arguments_2,char *arguments_3)

{
  int iVar1;
  kStatus kVar2;
  char **in_R9;
  char *arguments_local_3;
  char *arguments_local_2;
  char *arguments_local_1;
  char *arguments_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  
  kVar2 = kFiltered;
  if ((this->isEnabled == true) && ((int)this->logLevelThreshold < 0xc9)) {
    arguments_local_3 = arguments_3;
    arguments_local_2 = arguments_2;
    arguments_local_1 = arguments_1;
    arguments_local = arguments;
    ::fmt::v10::sprintf<char_const*,char_const*,char_const*,char_const*,char>
              (&str,(v10 *)&arguments_local,&arguments_local_1,&arguments_local_2,&arguments_local_3
               ,in_R9);
    iVar1 = SendLogMessage(this,kInfo,&str);
    kVar2 = (uint)(iVar1 < 1) * 2;
    std::__cxx11::string::~string((string *)&str);
  }
  return kVar2;
}

Assistant:

inline kStatus Info(T... arguments) const {
            if (!(isEnabled && WithinRange(kInfo))) return kStatus::kFiltered;
            auto str = fmt::sprintf(arguments...);
            return (SendLogMessage(kInfo, str) > 0) ? kStatus::kOk : kStatus::kSendError;
        }